

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

double js_math_sign(double a)

{
  double a_local;
  double local_8;
  
  local_8 = a;
  if ((!NAN(a)) && ((a != 0.0 || (NAN(a))))) {
    if (0.0 <= a) {
      local_8 = 1.0;
    }
    else {
      local_8 = -1.0;
    }
  }
  return local_8;
}

Assistant:

static double js_math_sign(double a)
{
    if (isnan(a) || a == 0.0)
        return a;
    if (a < 0)
        return -1;
    else
        return 1;
}